

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

bool __thiscall positionTy::isNormal(positionTy *this,bool bAllowNanAltIfGnd)

{
  bool bVar1;
  uint uVar2;
  LTError *this_00;
  byte in_SIL;
  positionTy *in_RDI;
  double dVar3;
  bool local_33;
  bool local_32;
  bool local_31;
  
  if (((SUB21(in_RDI->f,1) >> 3 & 1) == 0) && ((SUB21(in_RDI->f,1) >> 2 & 1) == 0)) {
    dVar3 = lat(in_RDI);
    uVar2 = std::isnan(dVar3);
    local_31 = false;
    if ((uVar2 & 1) == 0) {
      dVar3 = lon(in_RDI);
      uVar2 = std::isnan(dVar3);
      local_31 = false;
      if ((uVar2 & 1) == 0) {
        dVar3 = ts(in_RDI);
        uVar2 = std::isnan(dVar3);
        local_31 = false;
        if ((uVar2 & 1) == 0) {
          dVar3 = lat(in_RDI);
          local_31 = false;
          if (-90.0 <= dVar3) {
            dVar3 = lat(in_RDI);
            local_31 = false;
            if (dVar3 <= 90.0) {
              dVar3 = lon(in_RDI);
              local_31 = false;
              if (-180.0 <= dVar3) {
                dVar3 = lon(in_RDI);
                local_31 = false;
                if (dVar3 <= 180.0) {
                  bVar1 = IsOnGnd(in_RDI);
                  if ((!bVar1) || (local_32 = true, (in_SIL & 1) == 0)) {
                    dVar3 = alt_m(in_RDI);
                    uVar2 = std::isnan(dVar3);
                    local_33 = false;
                    if ((uVar2 & 1) == 0) {
                      dVar3 = alt_ft((positionTy *)0x12fe5e);
                      local_33 = false;
                      if (-1500.0 <= dVar3) {
                        dVar3 = alt_ft((positionTy *)0x12fe7c);
                        local_33 = dVar3 <= 60000.0;
                      }
                    }
                    local_32 = local_33;
                  }
                  local_31 = local_32;
                }
              }
            }
          }
        }
      }
    }
    return local_31;
  }
  this_00 = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                   ,0x1bb,"isNormal",logFATAL,"ASSERT FAILED: %s",
                   "f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD");
  __cxa_throw(this_00,&LTError::typeinfo,LTError::~LTError);
}

Assistant:

bool positionTy::isNormal (bool bAllowNanAltIfGnd) const
{
    LOG_ASSERT(f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD);
    return
        // should be actual numbers
        ( !std::isnan(lat()) && !std::isnan(lon()) && !std::isnan(ts())) &&
        // should normal latitudes/longitudes
        (  -90 <= lat() && lat() <=    90)  &&
        ( -180 <= lon() && lon() <=   180) &&
        // altitude can be Null - but only if on ground and specifically allowed by parameter
        ( (IsOnGnd() && bAllowNanAltIfGnd) ||
        // altitude: a 'little' below MSL might be possible (dead sea),
        //           no more than 60.000ft...we are talking planes, not rockets ;)
          (!std::isnan(alt_m()) && MDL_ALT_MIN <= alt_ft() && alt_ft() <= MDL_ALT_MAX) );
}